

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O1

Material * __thiscall Assimp::D3DS::Material::operator=(Material *this,Material *other)

{
  ai_real aVar1;
  aiTextureMapMode aVar2;
  bool bVar3;
  undefined3 uVar4;
  int iVar5;
  ai_real aVar6;
  ai_real aVar7;
  ai_real aVar8;
  
  std::__cxx11::string::_M_assign((string *)&this->mName);
  (this->mDiffuse).r = (other->mDiffuse).r;
  (this->mDiffuse).g = (other->mDiffuse).g;
  (this->mDiffuse).b = (other->mDiffuse).b;
  aVar1 = other->mShininessStrength;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = aVar1;
  (this->mSpecular).r = (other->mSpecular).r;
  (this->mSpecular).g = (other->mSpecular).g;
  (this->mSpecular).b = (other->mSpecular).b;
  (this->mAmbient).r = (other->mAmbient).r;
  (this->mAmbient).g = (other->mAmbient).g;
  (this->mAmbient).b = (other->mAmbient).b;
  aVar1 = other->mTransparency;
  this->mShading = other->mShading;
  this->mTransparency = aVar1;
  (this->sTexDiffuse).mTextureBlend = (other->sTexDiffuse).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexDiffuse).mMapName);
  aVar1 = (other->sTexDiffuse).mOffsetU;
  aVar6 = (other->sTexDiffuse).mOffsetV;
  aVar7 = (other->sTexDiffuse).mScaleU;
  aVar8 = (other->sTexDiffuse).mScaleV;
  aVar2 = (other->sTexDiffuse).mMapMode;
  bVar3 = (other->sTexDiffuse).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexDiffuse).field_0x41;
  iVar5 = (other->sTexDiffuse).iUVSrc;
  (this->sTexDiffuse).mRotation = (other->sTexDiffuse).mRotation;
  (this->sTexDiffuse).mMapMode = aVar2;
  (this->sTexDiffuse).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexDiffuse).field_0x41 = uVar4;
  (this->sTexDiffuse).iUVSrc = iVar5;
  (this->sTexDiffuse).mOffsetU = aVar1;
  (this->sTexDiffuse).mOffsetV = aVar6;
  (this->sTexDiffuse).mScaleU = aVar7;
  (this->sTexDiffuse).mScaleV = aVar8;
  (this->sTexOpacity).mTextureBlend = (other->sTexOpacity).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexOpacity).mMapName);
  aVar1 = (other->sTexOpacity).mOffsetU;
  aVar6 = (other->sTexOpacity).mOffsetV;
  aVar7 = (other->sTexOpacity).mScaleU;
  aVar8 = (other->sTexOpacity).mScaleV;
  aVar2 = (other->sTexOpacity).mMapMode;
  bVar3 = (other->sTexOpacity).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexOpacity).field_0x41;
  iVar5 = (other->sTexOpacity).iUVSrc;
  (this->sTexOpacity).mRotation = (other->sTexOpacity).mRotation;
  (this->sTexOpacity).mMapMode = aVar2;
  (this->sTexOpacity).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexOpacity).field_0x41 = uVar4;
  (this->sTexOpacity).iUVSrc = iVar5;
  (this->sTexOpacity).mOffsetU = aVar1;
  (this->sTexOpacity).mOffsetV = aVar6;
  (this->sTexOpacity).mScaleU = aVar7;
  (this->sTexOpacity).mScaleV = aVar8;
  (this->sTexSpecular).mTextureBlend = (other->sTexSpecular).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexSpecular).mMapName);
  aVar1 = (other->sTexSpecular).mOffsetU;
  aVar6 = (other->sTexSpecular).mOffsetV;
  aVar7 = (other->sTexSpecular).mScaleU;
  aVar8 = (other->sTexSpecular).mScaleV;
  aVar2 = (other->sTexSpecular).mMapMode;
  bVar3 = (other->sTexSpecular).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexSpecular).field_0x41;
  iVar5 = (other->sTexSpecular).iUVSrc;
  (this->sTexSpecular).mRotation = (other->sTexSpecular).mRotation;
  (this->sTexSpecular).mMapMode = aVar2;
  (this->sTexSpecular).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexSpecular).field_0x41 = uVar4;
  (this->sTexSpecular).iUVSrc = iVar5;
  (this->sTexSpecular).mOffsetU = aVar1;
  (this->sTexSpecular).mOffsetV = aVar6;
  (this->sTexSpecular).mScaleU = aVar7;
  (this->sTexSpecular).mScaleV = aVar8;
  (this->sTexReflective).mTextureBlend = (other->sTexReflective).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexReflective).mMapName);
  aVar1 = (other->sTexReflective).mOffsetU;
  aVar6 = (other->sTexReflective).mOffsetV;
  aVar7 = (other->sTexReflective).mScaleU;
  aVar8 = (other->sTexReflective).mScaleV;
  aVar2 = (other->sTexReflective).mMapMode;
  bVar3 = (other->sTexReflective).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexReflective).field_0x41;
  iVar5 = (other->sTexReflective).iUVSrc;
  (this->sTexReflective).mRotation = (other->sTexReflective).mRotation;
  (this->sTexReflective).mMapMode = aVar2;
  (this->sTexReflective).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexReflective).field_0x41 = uVar4;
  (this->sTexReflective).iUVSrc = iVar5;
  (this->sTexReflective).mOffsetU = aVar1;
  (this->sTexReflective).mOffsetV = aVar6;
  (this->sTexReflective).mScaleU = aVar7;
  (this->sTexReflective).mScaleV = aVar8;
  (this->sTexBump).mTextureBlend = (other->sTexBump).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexBump).mMapName);
  aVar1 = (other->sTexBump).mOffsetU;
  aVar6 = (other->sTexBump).mOffsetV;
  aVar7 = (other->sTexBump).mScaleU;
  aVar8 = (other->sTexBump).mScaleV;
  aVar2 = (other->sTexBump).mMapMode;
  bVar3 = (other->sTexBump).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexBump).field_0x41;
  iVar5 = (other->sTexBump).iUVSrc;
  (this->sTexBump).mRotation = (other->sTexBump).mRotation;
  (this->sTexBump).mMapMode = aVar2;
  (this->sTexBump).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexBump).field_0x41 = uVar4;
  (this->sTexBump).iUVSrc = iVar5;
  (this->sTexBump).mOffsetU = aVar1;
  (this->sTexBump).mOffsetV = aVar6;
  (this->sTexBump).mScaleU = aVar7;
  (this->sTexBump).mScaleV = aVar8;
  (this->sTexEmissive).mTextureBlend = (other->sTexEmissive).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexEmissive).mMapName);
  aVar1 = (other->sTexEmissive).mOffsetU;
  aVar6 = (other->sTexEmissive).mOffsetV;
  aVar7 = (other->sTexEmissive).mScaleU;
  aVar8 = (other->sTexEmissive).mScaleV;
  aVar2 = (other->sTexEmissive).mMapMode;
  bVar3 = (other->sTexEmissive).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexEmissive).field_0x41;
  iVar5 = (other->sTexEmissive).iUVSrc;
  (this->sTexEmissive).mRotation = (other->sTexEmissive).mRotation;
  (this->sTexEmissive).mMapMode = aVar2;
  (this->sTexEmissive).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexEmissive).field_0x41 = uVar4;
  (this->sTexEmissive).iUVSrc = iVar5;
  (this->sTexEmissive).mOffsetU = aVar1;
  (this->sTexEmissive).mOffsetV = aVar6;
  (this->sTexEmissive).mScaleU = aVar7;
  (this->sTexEmissive).mScaleV = aVar8;
  (this->sTexShininess).mTextureBlend = (other->sTexShininess).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexShininess).mMapName);
  aVar1 = (other->sTexShininess).mOffsetU;
  aVar6 = (other->sTexShininess).mOffsetV;
  aVar7 = (other->sTexShininess).mScaleU;
  aVar8 = (other->sTexShininess).mScaleV;
  aVar2 = (other->sTexShininess).mMapMode;
  bVar3 = (other->sTexShininess).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexShininess).field_0x41;
  iVar5 = (other->sTexShininess).iUVSrc;
  (this->sTexShininess).mRotation = (other->sTexShininess).mRotation;
  (this->sTexShininess).mMapMode = aVar2;
  (this->sTexShininess).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexShininess).field_0x41 = uVar4;
  (this->sTexShininess).iUVSrc = iVar5;
  (this->sTexShininess).mOffsetU = aVar1;
  (this->sTexShininess).mOffsetV = aVar6;
  (this->sTexShininess).mScaleU = aVar7;
  (this->sTexShininess).mScaleV = aVar8;
  this->mBumpHeight = other->mBumpHeight;
  (this->mEmissive).r = (other->mEmissive).r;
  (this->mEmissive).g = (other->mEmissive).g;
  (this->mEmissive).b = (other->mEmissive).b;
  (this->sTexAmbient).mTextureBlend = (other->sTexAmbient).mTextureBlend;
  std::__cxx11::string::_M_assign((string *)&(this->sTexAmbient).mMapName);
  aVar1 = (other->sTexAmbient).mOffsetU;
  aVar6 = (other->sTexAmbient).mOffsetV;
  aVar7 = (other->sTexAmbient).mScaleU;
  aVar8 = (other->sTexAmbient).mScaleV;
  aVar2 = (other->sTexAmbient).mMapMode;
  bVar3 = (other->sTexAmbient).bPrivate;
  uVar4 = *(undefined3 *)&(other->sTexAmbient).field_0x41;
  iVar5 = (other->sTexAmbient).iUVSrc;
  (this->sTexAmbient).mRotation = (other->sTexAmbient).mRotation;
  (this->sTexAmbient).mMapMode = aVar2;
  (this->sTexAmbient).bPrivate = bVar3;
  *(undefined3 *)&(this->sTexAmbient).field_0x41 = uVar4;
  (this->sTexAmbient).iUVSrc = iVar5;
  (this->sTexAmbient).mOffsetU = aVar1;
  (this->sTexAmbient).mOffsetV = aVar6;
  (this->sTexAmbient).mScaleU = aVar7;
  (this->sTexAmbient).mScaleV = aVar8;
  this->mTwoSided = other->mTwoSided;
  return this;
}

Assistant:

Material &operator=(const Material &other) = default;